

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O0

ptls_aead_context_t *
ptls_aead_new(ptls_aead_algorithm_t *aead,ptls_hash_algorithm_t *hash,int is_enc,void *secret)

{
  void *__dest;
  ptls_aead_algorithm_t *local_90 [6];
  int local_5c;
  undefined1 local_58 [4];
  int ret;
  uint8_t key [32];
  ptls_aead_context_t *ctx;
  void *secret_local;
  int is_enc_local;
  ptls_hash_algorithm_t *hash_local;
  ptls_aead_algorithm_t *aead_local;
  
  __dest = malloc(aead->context_size);
  if (__dest == (void *)0x0) {
    aead_local = (ptls_aead_algorithm_t *)0x0;
  }
  else {
    key._24_8_ = __dest;
    memset(local_90,0,0x30);
    local_90[0] = aead;
    memcpy(__dest,local_90,0x30);
    local_5c = get_traffic_key(hash,local_58,aead->key_size,0,secret);
    if ((local_5c == 0) &&
       (local_5c = get_traffic_key(hash,(void *)(key._24_8_ + 0x10),aead->iv_size,1,secret),
       local_5c == 0)) {
      local_5c = (*aead->setup_crypto)((ptls_aead_context_t *)key._24_8_,is_enc,local_58);
    }
    (*ptls_clear_memory)(local_58,aead->key_size);
    if (local_5c != 0) {
      (*ptls_clear_memory)((void *)(key._24_8_ + 0x10),aead->iv_size);
      free((void *)key._24_8_);
      key[0x18] = '\0';
      key[0x19] = '\0';
      key[0x1a] = '\0';
      key[0x1b] = '\0';
      key[0x1c] = '\0';
      key[0x1d] = '\0';
      key[0x1e] = '\0';
      key[0x1f] = '\0';
    }
    aead_local = (ptls_aead_algorithm_t *)key._24_8_;
  }
  return (ptls_aead_context_t *)aead_local;
}

Assistant:

ptls_aead_context_t *ptls_aead_new(ptls_aead_algorithm_t *aead, ptls_hash_algorithm_t *hash, int is_enc, const void *secret)
{
    ptls_aead_context_t *ctx;
    uint8_t key[PTLS_MAX_SECRET_SIZE];
    int ret;

    if ((ctx = (ptls_aead_context_t *)malloc(aead->context_size)) == NULL)
        return NULL;

    *ctx = (ptls_aead_context_t){aead};
    if ((ret = get_traffic_key(hash, key, aead->key_size, 0, secret)) != 0)
        goto Exit;
    if ((ret = get_traffic_key(hash, ctx->static_iv, aead->iv_size, 1, secret)) != 0)
        goto Exit;
    ret = aead->setup_crypto(ctx, is_enc, key);

Exit:
    ptls_clear_memory(key, aead->key_size);
    if (ret != 0) {
        ptls_clear_memory(ctx->static_iv, aead->iv_size);
        free(ctx);
        ctx = NULL;
    }

    return ctx;
}